

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,long a_nValue,char *a_pComment,bool a_bUseHex,bool a_bForceReplace)

{
  SI_Error SVar1;
  size_t sVar2;
  char *__format;
  char szOutput [64];
  char szInput [64];
  
  if (a_pKey == (char *)0x0 || a_pSection == (char *)0x0) {
    SVar1 = SI_FAIL;
  }
  else {
    __format = "%ld";
    if (a_bUseHex) {
      __format = "0x%lx";
    }
    sprintf(szInput,__format,a_nValue);
    sVar2 = strlen(szInput);
    if (sVar2 + 1 < 0x41) {
      memcpy(szOutput,szInput,sVar2 + 1);
    }
    SVar1 = AddEntry(this,a_pSection,a_pKey,szOutput,a_pComment,a_bForceReplace,true);
  }
  return SVar1;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::SetLongValue(const SI_CHAR *a_pSection,
																		  const SI_CHAR *a_pKey, long a_nValue,
																		  const SI_CHAR *a_pComment, bool a_bUseHex,
																		  bool a_bForceReplace) {
	// use SetValue to create sections
	if (!a_pSection || !a_pKey) return SI_FAIL;

	// convert to an ASCII string
	char szInput[64];
#if __STDC_WANT_SECURE_LIB__ && !_WIN32_WCE
	sprintf_s(szInput, a_bUseHex ? "0x%lx" : "%ld", a_nValue);
#else  // !__STDC_WANT_SECURE_LIB__
	sprintf(szInput, a_bUseHex ? "0x%lx" : "%ld", a_nValue);
#endif  // __STDC_WANT_SECURE_LIB__

	// convert to output text
	SI_CHAR szOutput[64];
	SI_CONVERTER c(m_bStoreIsUtf8);
	c.ConvertFromStore(szInput, strlen(szInput) + 1, szOutput, sizeof(szOutput) / sizeof(SI_CHAR));

	// actually add it
	return AddEntry(a_pSection, a_pKey, szOutput, a_pComment, a_bForceReplace, true);
}